

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

undefined4 __thiscall despot::TagBlindBeliefPolicy::Value(TagBlindBeliefPolicy *this,Belief *belief)

{
  int iVar1;
  double dVar2;
  double value;
  ACT_TYPE action;
  int bestAction;
  double bestValue;
  Belief *belief_local;
  TagBlindBeliefPolicy *this_local;
  
  _action = Globals::NEG_INFTY;
  value._4_4_ = -1;
  value._0_4_ = 0;
  while( true ) {
    iVar1 = (**(code **)(*(long *)this->tag_model_ + 0x18))();
    if (iVar1 <= value._0_4_) break;
    dVar2 = (double)despot::MDP::ComputeActionValue
                              ((ParticleBelief *)this->tag_model_,(StateIndexer *)belief,
                               (int)this->tag_model_ + 0x40);
    if (_action < dVar2) {
      value._4_4_ = value._0_4_;
      _action = dVar2;
    }
    value._0_4_ = value._0_4_ + 1;
  }
  despot::ValuedAction::ValuedAction((ValuedAction *)&this_local,value._4_4_,_action);
  return this_local._0_4_;
}

Assistant:

ValuedAction Value(const Belief* belief) const {
		double bestValue = Globals::NEG_INFTY;
		int bestAction = -1;
		for (ACT_TYPE action = 0; action < tag_model_->NumActions(); action++) {
			double value = tag_model_->ComputeActionValue(
				static_cast<const ParticleBelief*>(belief), *tag_model_,
				action);
			if (value > bestValue) {
				bestValue = value;
				bestAction = action;
			}
		}

		return ValuedAction(bestAction, bestValue);
	}